

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              int *cost_list,FULLPEL_MV *best_mv,FULLPEL_MV_STATS *best_mv_stats,
              FULLPEL_MV *second_best_mv)

{
  byte bVar1;
  MV_COST_TYPE MVar2;
  FULLPEL_MV FVar3;
  aom_sad_fn_t p_Var4;
  buf_2d *pbVar5;
  buf_2d *pbVar6;
  uint8_t *puVar7;
  MESH_PATTERN *pMVar8;
  uint8_t *puVar9;
  MV *pMVar10;
  short sVar11;
  undefined8 *puVar12;
  int16_t iVar13;
  FULLPEL_MV *this_mv;
  uint *puVar14;
  uint *puVar15;
  FULLPEL_MOTION_SEARCH_PARAMS *pFVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  ulong uVar23;
  long lVar24;
  short sVar25;
  uint uVar26;
  undefined4 in_register_00000014;
  ushort uVar27;
  ushort uVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  int iVar33;
  search_site_config *psVar34;
  int i_1;
  int iVar35;
  uint8_t *puVar36;
  short sVar37;
  int i;
  long lVar38;
  int i_2;
  int iVar39;
  bool bVar40;
  bool bVar41;
  FULLPEL_MV tmp_mv_ex;
  int num00;
  FULLPEL_MV tmp_best_mv;
  FULLPEL_MV_STATS tmp_mv_stats;
  FULLPEL_MV local_178;
  int local_174;
  FULLPEL_MV *local_170;
  undefined8 local_168;
  ulong local_160;
  uint *local_158;
  FULLPEL_MV_STATS *local_150;
  FULLPEL_MOTION_SEARCH_PARAMS *local_148;
  search_site_config *local_140;
  int local_134;
  int local_130;
  FULLPEL_MV local_12c;
  long local_128;
  uint local_120;
  FULLPEL_MV local_11c;
  ulong local_118;
  FULLPEL_MOTION_SEARCH_PARAMS local_110;
  
  local_160 = CONCAT44(in_register_00000014,step_param);
  local_118 = (ulong)ms_params->bsize;
  bVar1 = ms_params->search_method;
  lVar38 = (long)ms_params->is_intra_mode;
  uVar21 = ms_params->run_mesh_search;
  best_mv->row = -0x8000;
  best_mv->col = -0x8000;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    second_best_mv->row = -0x8000;
    second_best_mv->col = -0x8000;
  }
  if (cost_list != (int *)0x0) {
    cost_list[0] = 0x7fffffff;
    cost_list[1] = 0x7fffffff;
    cost_list[2] = 0x7fffffff;
    cost_list[3] = 0x7fffffff;
    cost_list[4] = 0x7fffffff;
  }
  local_120 = (uint)bVar1;
  local_170 = best_mv;
  local_158 = (uint *)cost_list;
  local_150 = best_mv_stats;
  local_148 = ms_params;
  local_12c = start_mv;
  local_128 = lVar38;
  switch(bVar1) {
  case 0:
  case 1:
  case 2:
  case 3:
    local_140 = ms_params->search_sites;
    local_130 = 0;
    iVar35 = (int)start_mv >> 0x10;
    iVar33 = (ms_params->mv_limits).col_min;
    iVar20 = (ms_params->mv_limits).col_max;
    if (iVar35 < iVar20) {
      iVar20 = iVar35;
    }
    if (iVar35 < iVar33) {
      iVar20 = iVar33;
    }
    iVar35 = (int)start_mv.row;
    iVar33 = (ms_params->mv_limits).row_max;
    if (iVar35 < iVar33) {
      iVar33 = iVar35;
    }
    iVar39 = (ms_params->mv_limits).row_min;
    if (iVar35 < iVar39) {
      iVar33 = iVar39;
    }
    pbVar5 = (ms_params->ms_buffers).ref;
    iVar35 = pbVar5->stride;
    local_168 = CONCAT44(local_168._4_4_,iVar33) & 0xffffffff0000ffff;
    bVar1 = (ms_params->mv_cost_params).mv_cost_type;
    if (bVar1 < 4) {
      sVar37 = (short)iVar33 - (ms_params->mv_cost_params).full_ref_mv.row;
      uVar22 = sVar37 * 8;
      sVar32 = (short)iVar20 - (ms_params->mv_cost_params).full_ref_mv.col;
      uVar27 = sVar32 * 8;
      switch(bVar1) {
      case 0:
        uVar19 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar22] +
                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                          (ulong)((uint)(uVar27 != 0) * 4 + (uint)(uVar22 != 0) * 8)) +
                 (ms_params->mv_cost_params).mvcost[1][(short)uVar27]) *
                 (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
        break;
      case 1:
        uVar28 = sVar37 * -8;
        if ((short)(sVar37 * -8) < 0) {
          uVar28 = uVar22;
        }
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar27;
        }
        uVar19 = ((uint)uVar22 + (uint)uVar28) * 4;
        break;
      case 2:
        uVar28 = sVar37 * -8;
        if ((short)(sVar37 * -8) < 0) {
          uVar28 = uVar22;
        }
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar27;
        }
        uVar19 = ((uint)uVar22 + (uint)uVar28) * 0xf >> 3;
        break;
      case 3:
        uVar28 = sVar37 * -8;
        if ((short)(sVar37 * -8) < 0) {
          uVar28 = uVar22;
        }
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar27;
        }
        uVar19 = (uint)uVar22 + (uint)uVar28;
      }
    }
    else {
      uVar19 = 0;
    }
    local_168 = CONCAT44(local_168._4_4_,(int)local_168._0_4_ + iVar20 * 0x10000);
    pbVar6 = (ms_params->ms_buffers).src;
    puVar36 = pbVar5->buf + ((int)(short)iVar20 + (short)iVar33 * iVar35);
    puVar7 = (ms_params->ms_buffers).second_pred;
    if (puVar7 == (uint8_t *)0x0) {
      uVar17 = (*ms_params->sdf)(pbVar6->buf,pbVar6->stride,puVar36,iVar35);
    }
    else {
      puVar9 = (ms_params->ms_buffers).mask;
      if (puVar9 == (uint8_t *)0x0) {
        uVar17 = (*ms_params->vfp->sdaf)(pbVar6->buf,pbVar6->stride,puVar36,iVar35,puVar7);
      }
      else {
        uVar17 = (*ms_params->vfp->msdf)
                           (pbVar6->buf,pbVar6->stride,puVar36,iVar35,puVar7,puVar9,
                            (ms_params->ms_buffers).mask_stride,(ms_params->ms_buffers).inv_mask);
      }
    }
    this_mv = local_170;
    uVar18 = (uint)local_160;
    diamond_search_sad(local_168._0_4_,uVar17 + uVar19,ms_params,uVar18,(int *)&local_178,local_170,
                       second_best_mv);
    local_174 = get_mvpred_compound_var_cost(ms_params,this_mv,local_150);
    iVar33 = ~uVar18 + local_140->num_search_steps;
    if ((int)local_178 < iVar33) {
      iVar20 = local_174;
      do {
        pFVar16 = local_148;
        diamond_search_sad(local_168._0_4_,uVar17 + uVar19,local_148,
                           (int)local_178 + (int)local_160 + 1,&local_130,&local_11c,second_best_mv)
        ;
        iVar35 = get_mvpred_compound_var_cost(pFVar16,&local_11c,(FULLPEL_MV_STATS *)&local_110);
        local_174 = iVar20;
        if (iVar35 < iVar20) {
          *local_170 = local_11c;
          local_150->sse = (uint)local_110.vfp;
          local_150->err_cost = local_110._0_4_;
          local_150->distortion = local_110._4_4_;
          local_174 = iVar35;
        }
        local_178 = (FULLPEL_MV)((int)local_178 + 1);
        if (local_130 != 0) {
          local_178 = (FULLPEL_MV)(local_130 + (int)local_178);
          local_130 = 0;
        }
        iVar20 = local_174;
      } while ((int)local_178 < iVar33);
    }
    ms_params = local_148;
    puVar14 = local_158;
    lVar38 = local_128;
    if (local_158 != (uint *)0x0) {
      FVar3 = *local_170;
      local_168 = (ulong)(uint)FVar3;
      local_140 = (search_site_config *)(ulong)((uint)FVar3 >> 0x10);
      pbVar5 = (local_148->ms_buffers).ref;
      pbVar6 = (local_148->ms_buffers).src;
      local_134 = pbVar5->stride;
      iVar20 = (int)FVar3 >> 0x10;
      iVar33 = (int)FVar3.row;
      uVar19 = (*local_148->sdf)(pbVar6->buf,pbVar6->stride,
                                 pbVar5->buf + (local_134 * iVar33 + iVar20),local_134);
      puVar15 = local_158;
      *puVar14 = uVar19;
      if (((((ms_params->mv_limits).row_min < iVar33) && (iVar33 < (ms_params->mv_limits).row_max))
          && ((ms_params->mv_limits).col_min < iVar20)) && (iVar20 < (ms_params->mv_limits).col_max)
         ) {
        lVar38 = 0;
        do {
          uVar19 = (*ms_params->sdf)(pbVar6->buf,pbVar6->stride,
                                     pbVar5->buf +
                                     ((int)(short)((&DAT_004e3f92)[lVar38 * 2] + (short)local_140) +
                                     (int)(short)((&calc_int_sad_list_neighbors)[lVar38 * 2] +
                                                 (short)local_168) * pbVar5->stride),local_134);
          puVar15[lVar38 + 1] = uVar19;
          lVar38 = lVar38 + 1;
          psVar34 = local_140;
        } while (lVar38 != 4);
      }
      else {
        lVar38 = 0;
        psVar34 = local_140;
        do {
          iVar33 = (int)(short)((&DAT_004e3f92)[lVar38 * 2] + (short)psVar34);
          uVar19 = 0x7fffffff;
          if (((ms_params->mv_limits).col_min <= iVar33) &&
             (iVar33 <= (ms_params->mv_limits).col_max)) {
            iVar20 = (int)(short)((&calc_int_sad_list_neighbors)[lVar38 * 2] + (short)local_168);
            if (((ms_params->mv_limits).row_min <= iVar20) &&
               (iVar20 <= (ms_params->mv_limits).row_max)) {
              uVar19 = (*local_148->sdf)(pbVar6->buf,pbVar6->stride,
                                         pbVar5->buf + (iVar20 * pbVar5->stride + iVar33),local_134)
              ;
              psVar34 = local_140;
            }
          }
          local_158[lVar38 + 1] = uVar19;
          lVar38 = lVar38 + 1;
          ms_params = local_148;
        } while (lVar38 != 4);
      }
      bVar1 = (ms_params->mv_cost_params).mv_cost_type;
      sVar32 = (short)local_168 - (ms_params->mv_cost_params).full_ref_mv.row;
      local_168 = CONCAT62((int6)(local_168 >> 0x10),sVar32);
      sVar37 = (short)psVar34 - (ms_params->mv_cost_params).full_ref_mv.col;
      if (bVar1 < 4) {
        uVar22 = sVar32 * 8;
        uVar27 = sVar37 * 8;
        switch(bVar1) {
        case 0:
          uVar19 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar22] +
                    *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                            (ulong)((uint)(uVar27 != 0) * 4 + (uint)(uVar22 != 0) * 8)) +
                   (ms_params->mv_cost_params).mvcost[1][(short)uVar27]) *
                   (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
          break;
        case 1:
          uVar28 = sVar32 * -8;
          if ((short)(sVar32 * -8) < 0) {
            uVar28 = uVar22;
          }
          uVar22 = sVar37 * -8;
          if ((short)(sVar37 * -8) < 0) {
            uVar22 = uVar27;
          }
          uVar19 = ((uint)uVar22 + (uint)uVar28) * 4;
          break;
        case 2:
          uVar28 = sVar32 * -8;
          if ((short)(sVar32 * -8) < 0) {
            uVar28 = uVar22;
          }
          uVar22 = sVar37 * -8;
          if ((short)(sVar37 * -8) < 0) {
            uVar22 = uVar27;
          }
          uVar19 = ((uint)uVar22 + (uint)uVar28) * 0xf >> 3;
          break;
        case 3:
          uVar28 = sVar32 * -8;
          if ((short)(sVar32 * -8) < 0) {
            uVar28 = uVar22;
          }
          uVar22 = sVar37 * -8;
          if ((short)(sVar37 * -8) < 0) {
            uVar22 = uVar27;
          }
          uVar19 = (uint)uVar22 + (uint)uVar28;
        }
      }
      else {
        uVar19 = 0;
      }
      *local_158 = *local_158 + uVar19;
      lVar24 = 0;
      do {
        if (local_158[lVar24 + 1] != 0x7fffffff) {
          if (bVar1 < 4) {
            sVar31 = (&calc_int_sad_list_neighbors)[lVar24 * 2] + sVar32;
            uVar22 = sVar31 * 8;
            sVar30 = (&DAT_004e3f92)[lVar24 * 2] + sVar37;
            uVar27 = sVar30 * 8;
            switch(bVar1) {
            case 0:
              uVar19 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar22] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(uVar27 != 0) * 4 + (uint)(uVar22 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][(short)uVar27]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              uVar28 = sVar31 * -8;
              if ((short)(sVar31 * -8) < 0) {
                uVar28 = uVar22;
              }
              uVar22 = sVar30 * -8;
              if ((short)(sVar30 * -8) < 0) {
                uVar22 = uVar27;
              }
              uVar19 = ((uint)uVar22 + (uint)uVar28) * 4;
              break;
            case 2:
              uVar28 = sVar31 * -8;
              if ((short)(sVar31 * -8) < 0) {
                uVar28 = uVar22;
              }
              uVar22 = sVar30 * -8;
              if ((short)(sVar30 * -8) < 0) {
                uVar22 = uVar27;
              }
              uVar19 = ((uint)uVar22 + (uint)uVar28) * 0xf >> 3;
              break;
            case 3:
              uVar28 = sVar31 * -8;
              if ((short)(sVar31 * -8) < 0) {
                uVar28 = uVar22;
              }
              uVar22 = sVar30 * -8;
              if ((short)(sVar30 * -8) < 0) {
                uVar22 = uVar27;
              }
              uVar19 = (uint)uVar22 + (uint)uVar28;
            }
          }
          else {
            uVar19 = 0;
          }
          local_158[lVar24 + 1] = uVar19 + local_158[lVar24 + 1];
        }
        lVar24 = lVar24 + 1;
        lVar38 = local_128;
      } while (lVar24 != 4);
    }
    goto LAB_001d5ee1;
  case 4:
  case 5:
  case 6:
    iVar33 = 1;
    goto LAB_001d5ece;
  case 7:
  case 8:
    bVar41 = SBORROW4(step_param,10);
    bVar40 = step_param + -10 < 0;
    iVar33 = 9;
    break;
  case 9:
    bVar41 = SBORROW4(step_param,9);
    bVar40 = step_param + -9 < 0;
    iVar33 = 8;
    break;
  case 10:
    bVar41 = SBORROW4(step_param,0xb);
    bVar40 = step_param + -0xb < 0;
    iVar33 = 10;
    break;
  default:
    local_174 = 0;
    goto LAB_001d5ee1;
  }
  if (bVar41 == bVar40) {
    iVar33 = step_param;
  }
  step_param = iVar33;
  iVar33 = 0;
LAB_001d5ece:
  local_174 = pattern_search(start_mv,ms_params,step_param,iVar33,cost_list,best_mv,best_mv_stats);
LAB_001d5ee1:
  if (((uVar21 == 0) && (uVar21 = 0, (byte)((char)local_120 - 1U) < 2)) &&
     ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0)) {
    uVar21 = (uint)(ms_params->force_mesh_thresh >> (10 - (""[local_118] + ""[local_118]) & 0x1f) <
                   local_174);
  }
  if (((int)lVar38 == 0) && (ms_params->prune_mesh_search != 0)) {
    uVar17 = (int)local_12c.row - (int)local_170->row;
    uVar19 = -uVar17;
    if (0 < (int)uVar17) {
      uVar19 = uVar17;
    }
    uVar18 = ((int)local_12c >> 0x10) - (int)local_170->col;
    uVar17 = -uVar18;
    if (0 < (int)uVar18) {
      uVar17 = uVar18;
    }
    if (uVar17 < uVar19) {
      uVar17 = uVar19;
    }
    if ((int)uVar17 <= ms_params->mesh_search_mv_diff_threshold) {
      uVar21 = 0;
    }
  }
  p_Var4 = ms_params->vfp->sdf;
  if (ms_params->sdf != p_Var4) {
    pbVar5 = (ms_params->ms_buffers).ref;
    pbVar6 = (ms_params->ms_buffers).src;
    iVar33 = pbVar6->stride;
    iVar20 = pbVar5->stride;
    puVar7 = pbVar6->buf;
    puVar36 = pbVar5->buf + (long)local_170->col + (long)local_170->row * (long)iVar20;
    uVar19 = (*p_Var4)(puVar7,iVar33,puVar36,iVar20);
    uVar17 = (*ms_params->vfp->sdsf)(puVar7,iVar33,puVar36,iVar20);
    ms_params = local_148;
    puVar14 = local_158;
    bVar40 = true;
    if (1 << (""[local_118] + ""[local_118] & 0x1f) < (int)uVar19) {
      uVar17 = uVar17 - uVar19;
      uVar18 = -uVar17;
      if (0 < (int)uVar17) {
        uVar18 = uVar17;
      }
      uVar26 = 1;
      if (1 < (int)uVar19) {
        uVar26 = uVar19;
      }
      if (uVar26 * 9 <= uVar18 * 10) {
        memcpy(&local_110,local_148,0xe0);
        puVar12 = (undefined8 *)CONCAT44(local_110.vfp._4_4_,(uint)local_110.vfp);
        local_110.sdf = (aom_sad_fn_t)*puVar12;
        local_110.sdx4df = (aom_sad_multi_d_fn_t)puVar12[6];
        local_110.sdx3df = (aom_sad_multi_d_fn_t)puVar12[7];
        uVar17 = av1_full_pixel_search
                           (local_12c,&local_110,(int)local_160,(int *)puVar14,local_170,local_150,
                            second_best_mv);
        bVar40 = false;
      }
    }
    lVar38 = local_128;
    if (!bVar40) {
      return uVar17;
    }
  }
  if (uVar21 != 0) {
    pMVar8 = ms_params->mesh_patterns[lVar38];
    local_178 = *local_170;
    uVar21 = pMVar8->range;
    uVar19 = pMVar8->interval;
    iVar33 = 0x7fffffff;
    if (((0xffffff05 < uVar21 - 0x101) && (0 < (int)uVar19)) && ((int)uVar19 <= (int)uVar21)) {
      uVar27 = -local_178.row;
      if (0 < local_178.row) {
        uVar27 = local_178.row;
      }
      uVar22 = -local_178.col;
      if (0 < local_178.col) {
        uVar22 = local_178.col;
      }
      if (uVar22 < uVar27) {
        uVar22 = uVar27;
      }
      uVar17 = (uint)(uVar22 >> 2) + (uint)uVar22;
      if ((int)uVar17 < (int)uVar21) {
        uVar17 = uVar21;
      }
      uVar23 = 0x100;
      if ((int)uVar17 < 0x100) {
        uVar23 = (ulong)uVar17;
      }
      uVar21 = (uint)(uVar23 / ((ulong)uVar21 / (ulong)uVar19));
      if ((int)uVar21 < (int)uVar19) {
        uVar21 = uVar19;
      }
      uVar19 = 4;
      if ((int)uVar21 < 4) {
        uVar19 = uVar21;
      }
      if (ms_params->fine_search_interval == 0) {
        uVar19 = uVar21;
      }
      iVar20 = exhaustive_mesh_search
                         (local_178,ms_params,(int)uVar23,uVar19,&local_178,second_best_mv);
      if ((1 < (int)uVar19) && (7 < uVar17)) {
        lVar38 = 0;
        do {
          iVar20 = exhaustive_mesh_search
                             (local_178,ms_params,pMVar8[lVar38 + 1].range,
                              pMVar8[lVar38 + 1].interval,&local_178,second_best_mv);
          if (pMVar8[lVar38 + 1].interval == 1) break;
          bVar40 = lVar38 != 2;
          lVar38 = lVar38 + 1;
        } while (bVar40);
      }
      puVar14 = local_158;
      iVar33 = 0x7fffffff;
      if (iVar20 != 0x7fffffff) {
        iVar20 = (int)local_178.row;
        iVar13 = local_178.col;
        pbVar5 = (ms_params->ms_buffers).src;
        pbVar6 = (ms_params->ms_buffers).ref;
        iVar33 = pbVar6->stride;
        local_110._4_4_ =
             (*ms_params->vfp->vf)
                       (pbVar5->buf,pbVar5->stride,
                        pbVar6->buf + (iVar33 * iVar20 + (int)local_178.col),iVar33,
                        (uint *)&local_110.vfp);
        MVar2 = (ms_params->mv_cost_params).mv_cost_type;
        local_110._0_4_ = 0;
        if (MVar2 != '\x04') {
          pMVar10 = (ms_params->mv_cost_params).ref_mv;
          sVar32 = pMVar10->row;
          sVar30 = (short)(iVar20 << 3);
          sVar29 = sVar30 - sVar32;
          sVar37 = pMVar10->col;
          sVar25 = iVar13 * 8 - sVar37;
          sVar31 = -sVar29;
          if (0 < sVar29) {
            sVar31 = sVar29;
          }
          sVar11 = -sVar25;
          if (0 < sVar25) {
            sVar11 = sVar25;
          }
          if (MVar2 == '\x03') {
            local_110._0_4_ = (int)sVar11 + (int)sVar31 >> 3;
          }
          else if (MVar2 == '\x01') {
            local_110._0_4_ = (int)sVar11 + (int)sVar31 >> 2;
          }
          else {
            local_110._0_4_ = 0;
            if (MVar2 == '\0') {
              local_110._0_4_ =
                   SUB84(((long)(ms_params->mv_cost_params).mvcost[1][sVar25] +
                          (long)(ms_params->mv_cost_params).mvcost[0][sVar29] +
                         (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                       (ulong)((uint)((int16_t)(iVar13 * 8) != sVar37) * 4 +
                                              (uint)(sVar30 != sVar32) * 8))) *
                         (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe,0);
            }
          }
        }
        iVar33 = local_110._4_4_ + local_110._0_4_;
      }
      if (puVar14 != (uint *)0x0) {
        local_160 = (ulong)(uint)local_178;
        local_168 = (ulong)((uint)local_178 >> 0x10);
        pbVar5 = (ms_params->ms_buffers).ref;
        pbVar6 = (ms_params->ms_buffers).src;
        iVar20 = pbVar5->stride;
        iVar39 = (int)local_178 >> 0x10;
        iVar35 = (int)local_178.row;
        local_140 = (search_site_config *)CONCAT44(local_140._4_4_,iVar20);
        local_134 = iVar33;
        uVar21 = (*local_148->sdf)(pbVar6->buf,pbVar6->stride,
                                   pbVar5->buf + (iVar20 * iVar35 + iVar39),iVar20);
        pFVar16 = local_148;
        puVar15 = local_158;
        *puVar14 = uVar21;
        if ((((local_148->mv_limits).row_min < iVar35) && (iVar35 < (local_148->mv_limits).row_max))
           && (((local_148->mv_limits).col_min < iVar39 && (iVar39 < (local_148->mv_limits).col_max)
               ))) {
          lVar38 = 0;
          do {
            uVar21 = (*pFVar16->sdf)(pbVar6->buf,pbVar6->stride,
                                     pbVar5->buf +
                                     ((int)(short)((&DAT_004e3f92)[lVar38 * 2] + (short)local_168) +
                                     (int)(short)((&calc_int_sad_list_neighbors)[lVar38 * 2] +
                                                 (short)local_160) * pbVar5->stride),(int)local_140)
            ;
            puVar15[lVar38 + 1] = uVar21;
            lVar38 = lVar38 + 1;
            uVar23 = local_168;
          } while (lVar38 != 4);
        }
        else {
          lVar38 = 0;
          uVar23 = local_168;
          do {
            iVar33 = (int)(short)((&DAT_004e3f92)[lVar38 * 2] + (short)uVar23);
            uVar21 = 0x7fffffff;
            if (((pFVar16->mv_limits).col_min <= iVar33) && (iVar33 <= (pFVar16->mv_limits).col_max)
               ) {
              iVar20 = (int)(short)((&calc_int_sad_list_neighbors)[lVar38 * 2] + (short)local_160);
              if (((pFVar16->mv_limits).row_min <= iVar20) &&
                 (iVar20 <= (pFVar16->mv_limits).row_max)) {
                uVar21 = (*pFVar16->sdf)(pbVar6->buf,pbVar6->stride,
                                         pbVar5->buf + (iVar20 * pbVar5->stride + iVar33),
                                         (int)local_140);
                uVar23 = local_168;
              }
            }
            local_158[lVar38 + 1] = uVar21;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 4);
        }
        bVar1 = (pFVar16->mv_cost_params).mv_cost_type;
        sVar37 = (short)local_160 - (pFVar16->mv_cost_params).full_ref_mv.row;
        sVar32 = (short)uVar23 - (pFVar16->mv_cost_params).full_ref_mv.col;
        if (bVar1 < 4) {
          uVar27 = sVar37 * 8;
          uVar22 = sVar32 * 8;
          switch(bVar1) {
          case 0:
            uVar21 = ((local_148->mv_cost_params).mvcost[0][(short)uVar27] +
                      *(int *)((long)(local_148->mv_cost_params).mvjcost +
                              (ulong)((uint)(uVar22 != 0) * 4 + (uint)(uVar27 != 0) * 8)) +
                     (local_148->mv_cost_params).mvcost[1][(short)uVar22]) *
                     (local_148->mv_cost_params).sad_per_bit + 0x100U >> 9;
            break;
          case 1:
            uVar28 = sVar37 * -8;
            if ((short)(sVar37 * -8) < 0) {
              uVar28 = uVar27;
            }
            uVar27 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar27 = uVar22;
            }
            uVar21 = ((uint)uVar27 + (uint)uVar28) * 4;
            break;
          case 2:
            uVar28 = sVar37 * -8;
            if ((short)(sVar37 * -8) < 0) {
              uVar28 = uVar27;
            }
            uVar27 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar27 = uVar22;
            }
            uVar21 = ((uint)uVar27 + (uint)uVar28) * 0xf >> 3;
            break;
          case 3:
            uVar28 = sVar37 * -8;
            if ((short)(sVar37 * -8) < 0) {
              uVar28 = uVar27;
            }
            uVar27 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar27 = uVar22;
            }
            uVar21 = (uint)uVar27 + (uint)uVar28;
          }
        }
        else {
          uVar21 = 0;
        }
        *local_158 = *local_158 + uVar21;
        lVar38 = 0;
        do {
          if (local_158[lVar38 + 1] != 0x7fffffff) {
            if (bVar1 < 4) {
              sVar31 = (&calc_int_sad_list_neighbors)[lVar38 * 2] + sVar37;
              uVar22 = sVar31 * 8;
              sVar30 = (&DAT_004e3f92)[lVar38 * 2] + sVar32;
              uVar27 = sVar30 * 8;
              switch(bVar1) {
              case 0:
                uVar21 = ((local_148->mv_cost_params).mvcost[0][(short)uVar22] +
                          *(int *)((long)(local_148->mv_cost_params).mvjcost +
                                  (ulong)((uint)(uVar27 != 0) * 4 + (uint)(uVar22 != 0) * 8)) +
                         (local_148->mv_cost_params).mvcost[1][(short)uVar27]) *
                         (local_148->mv_cost_params).sad_per_bit + 0x100U >> 9;
                break;
              case 1:
                uVar28 = sVar31 * -8;
                if ((short)(sVar31 * -8) < 0) {
                  uVar28 = uVar22;
                }
                uVar22 = sVar30 * -8;
                if ((short)(sVar30 * -8) < 0) {
                  uVar22 = uVar27;
                }
                uVar21 = ((uint)uVar22 + (uint)uVar28) * 4;
                break;
              case 2:
                uVar28 = sVar31 * -8;
                if ((short)(sVar31 * -8) < 0) {
                  uVar28 = uVar22;
                }
                uVar22 = sVar30 * -8;
                if ((short)(sVar30 * -8) < 0) {
                  uVar22 = uVar27;
                }
                uVar21 = ((uint)uVar22 + (uint)uVar28) * 0xf >> 3;
                break;
              case 3:
                uVar28 = sVar31 * -8;
                if ((short)(sVar31 * -8) < 0) {
                  uVar28 = uVar22;
                }
                uVar22 = sVar30 * -8;
                if ((short)(sVar30 * -8) < 0) {
                  uVar22 = uVar27;
                }
                uVar21 = (uint)uVar22 + (uint)uVar28;
              }
            }
            else {
              uVar21 = 0;
            }
            local_158[lVar38 + 1] = uVar21 + local_158[lVar38 + 1];
          }
          lVar38 = lVar38 + 1;
          iVar33 = local_134;
        } while (lVar38 != 4);
      }
    }
    if (iVar33 < local_174) {
      local_150->sse = (uint)local_110.vfp;
      local_150->err_cost = local_110._0_4_;
      local_150->distortion = local_110._4_4_;
      *local_170 = local_178;
      local_174 = iVar33;
    }
  }
  return local_174;
}

Assistant:

int av1_full_pixel_search(const FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          const int step_param, int *cost_list,
                          FULLPEL_MV *best_mv, FULLPEL_MV_STATS *best_mv_stats,
                          FULLPEL_MV *second_best_mv) {
  const BLOCK_SIZE bsize = ms_params->bsize;
  const SEARCH_METHODS search_method = ms_params->search_method;

  const int is_intra_mode = ms_params->is_intra_mode;
  int run_mesh_search = ms_params->run_mesh_search;

  int var = 0;
  MARK_MV_INVALID(best_mv);
  if (second_best_mv) {
    MARK_MV_INVALID(second_best_mv);
  }

  if (cost_list) {
    cost_list[0] = INT_MAX;
    cost_list[1] = INT_MAX;
    cost_list[2] = INT_MAX;
    cost_list[3] = INT_MAX;
    cost_list[4] = INT_MAX;
  }

  assert(ms_params->ms_buffers.ref->stride == ms_params->search_sites->stride);

  switch (search_method) {
    case FAST_BIGDIA:
      var = fast_bigdia_search(start_mv, ms_params, step_param, 0, cost_list,
                               best_mv, best_mv_stats);
      break;
    case VFAST_DIAMOND:
      var = vfast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                             best_mv, best_mv_stats);
      break;
    case FAST_DIAMOND:
      var = fast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case FAST_HEX:
      var = fast_hex_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case HEX:
      var = hex_search(start_mv, ms_params, step_param, 1, cost_list, best_mv,
                       best_mv_stats);
      break;
    case SQUARE:
      var = square_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case BIGDIA:
      var = bigdia_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case NSTEP:
    case NSTEP_8PT:
    case DIAMOND:
    case CLAMPED_DIAMOND:
      var = full_pixel_diamond(start_mv, ms_params, step_param, cost_list,
                               best_mv, best_mv_stats, second_best_mv);
      break;
    default: assert(0 && "Invalid search method.");
  }

  // Should we allow a follow on exhaustive search?
  if (!run_mesh_search &&
      ((search_method == NSTEP) || (search_method == NSTEP_8PT)) &&
      !ms_params->ms_buffers.second_pred) {
    int exhaustive_thr = ms_params->force_mesh_thresh;
    exhaustive_thr >>=
        10 - (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    // Threshold variance for an exhaustive full search.
    if (var > exhaustive_thr) run_mesh_search = 1;
  }

  // TODO(yunqing): the following is used to reduce mesh search in temporal
  // filtering. Can extend it to intrabc.
  if (!is_intra_mode && ms_params->prune_mesh_search) {
    const int full_pel_mv_diff = AOMMAX(abs(start_mv.row - best_mv->row),
                                        abs(start_mv.col - best_mv->col));
    if (full_pel_mv_diff <= ms_params->mesh_search_mv_diff_threshold) {
      run_mesh_search = 0;
    }
  }

  if (ms_params->sdf != ms_params->vfp->sdf) {
    // If we are skipping rows when we perform the motion search, we need to
    // check the quality of skipping. If it's bad, then we run mesh search with
    // skip row features off.
    // TODO(chiyotsai@google.com): Handle the case where we have a vertical
    // offset of 1 before we hit this statement to avoid having to redo
    // motion search.
    const struct buf_2d *src = ms_params->ms_buffers.src;
    const struct buf_2d *ref = ms_params->ms_buffers.ref;
    const int src_stride = src->stride;
    const int ref_stride = ref->stride;

    const uint8_t *src_address = src->buf;
    const uint8_t *best_address = get_buf_from_fullmv(ref, best_mv);
    const int sad =
        ms_params->vfp->sdf(src_address, src_stride, best_address, ref_stride);
    const int skip_sad =
        ms_params->vfp->sdsf(src_address, src_stride, best_address, ref_stride);
    // We will keep the result of skipping rows if it's good enough. Here, good
    // enough means the error is less than 1 per pixel.
    const int kSADThresh =
        1 << (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    if (sad > kSADThresh && abs(skip_sad - sad) * 10 >= AOMMAX(sad, 1) * 9) {
      // There is a large discrepancy between skipping and not skipping, so we
      // need to redo the motion search.
      FULLPEL_MOTION_SEARCH_PARAMS new_ms_params = *ms_params;
      new_ms_params.sdf = new_ms_params.vfp->sdf;
      new_ms_params.sdx4df = new_ms_params.vfp->sdx4df;
      new_ms_params.sdx3df = new_ms_params.vfp->sdx3df;

      return av1_full_pixel_search(start_mv, &new_ms_params, step_param,
                                   cost_list, best_mv, best_mv_stats,
                                   second_best_mv);
    }
  }

  if (run_mesh_search) {
    int var_ex;
    FULLPEL_MV tmp_mv_ex;
    FULLPEL_MV_STATS tmp_mv_stats;
    // Pick the mesh pattern for exhaustive search based on the toolset (intraBC
    // or non-intraBC)
    // TODO(chiyotsai@google.com):  There is a bug here where the second best mv
    // gets overwritten without actually comparing the rdcost.
    const MESH_PATTERN *const mesh_patterns =
        ms_params->mesh_patterns[is_intra_mode];
    // TODO(chiyotsai@google.com): the second best mv is not set correctly by
    // full_pixel_exhaustive, which can incorrectly override it.
    var_ex =
        full_pixel_exhaustive(*best_mv, ms_params, mesh_patterns, cost_list,
                              &tmp_mv_ex, &tmp_mv_stats, second_best_mv);
    if (var_ex < var) {
      var = var_ex;
      *best_mv_stats = tmp_mv_stats;
      *best_mv = tmp_mv_ex;
    }
  }

  return var;
}